

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O0

int cupdlp_dcs_entry(cupdlp_dcs *T,int i,int j,double x)

{
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  undefined8 in_XMM0_Qa;
  int local_28;
  int local_24;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((((in_RDI == (int *)0x0) || (in_RDI[10] < 0)) || (in_ESI < 0)) || (in_EDX < 0)) {
    iVar1 = 0;
  }
  else {
    if ((*in_RDI <= in_RDI[10]) &&
       (iVar1 = cupdlp_dcs_sprealloc
                          ((cupdlp_dcs *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (int)((ulong)in_RDI >> 0x20)), iVar1 == 0)) {
      return 0;
    }
    if (*(long *)(in_RDI + 8) != 0) {
      *(undefined8 *)(*(long *)(in_RDI + 8) + (long)in_RDI[10] * 8) = in_XMM0_Qa;
    }
    *(int *)(*(long *)(in_RDI + 6) + (long)in_RDI[10] * 4) = in_ESI;
    iVar1 = in_RDI[10];
    in_RDI[10] = iVar1 + 1;
    *(int *)(*(long *)(in_RDI + 4) + (long)iVar1 * 4) = in_EDX;
    if (in_ESI + 1 < in_RDI[1]) {
      local_24 = in_RDI[1];
    }
    else {
      local_24 = in_ESI + 1;
    }
    in_RDI[1] = local_24;
    if (in_EDX + 1 < in_RDI[2]) {
      local_28 = in_RDI[2];
    }
    else {
      local_28 = in_EDX + 1;
    }
    in_RDI[2] = local_28;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int cupdlp_dcs_entry(cupdlp_dcs *T, int i, int j, double x) {
  if (!IS_TRIPLET(T) || i < 0 || j < 0) return (0); /* check inputs */
  if (T->nz >= T->nzmax && !cupdlp_dcs_sprealloc(T, 2 * (T->nzmax))) return (0);
  if (T->x) T->x[T->nz] = x;
  T->i[T->nz] = i;
  T->p[T->nz++] = j;
  T->m = MAX(T->m, i + 1);
  T->n = MAX(T->n, j + 1);
  return (1);
}